

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O2

void __thiscall Session::MainPoint(Session *this)

{
  bool bVar1;
  ostream *poVar2;
  string command;
  
  command._M_dataplus._M_p = (pointer)&command.field_2;
  std::__cxx11::string::_M_construct((ulong)&command,'\x14');
  while (this->m_Opened == true) {
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&std::cin,(string *)&command);
    bVar1 = Handler::RunCommand(&this->m_Handler,&command);
    if (!bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cout,"Command: ");
      poVar2 = std::operator<<(poVar2,(string *)&command);
      poVar2 = std::operator<<(poVar2," doesn\'t exists");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
  }
  std::__cxx11::string::~string((string *)&command);
  return;
}

Assistant:

void Session::MainPoint() {
    std::string command(20, '\0');
    while (IsOpened()) {
        std::getline(std::cin, command);
        if(!m_Handler.RunCommand(command)) {
            std::cout << "Command: " << command << " doesn't exists" << std::endl;
        }
    }
}